

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
reserve(vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_> *this
       ,size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  Bounds2<float> *pBVar4;
  long lVar5;
  int i;
  ulong uVar6;
  
  if (this->nAlloc < n) {
    pBVar4 = pmr::polymorphic_allocator<pbrt::Bounds2<float>>::allocate_object<pbrt::Bounds2<float>>
                       ((polymorphic_allocator<pbrt::Bounds2<float>> *)this,n);
    lVar5 = 0;
    for (uVar6 = 0; uVar6 < this->nStored; uVar6 = uVar6 + 1) {
      puVar1 = (undefined8 *)((long)&(this->ptr->pMin).super_Tuple2<pbrt::Point2,_float>.x + lVar5);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pBVar4->pMin).super_Tuple2<pbrt::Point2,_float>.x + lVar5);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      lVar5 = lVar5 + 0x10;
    }
    pmr::polymorphic_allocator<pbrt::Bounds2<float>>::deallocate_object<pbrt::Bounds2<float>>
              ((polymorphic_allocator<pbrt::Bounds2<float>> *)this,this->ptr,this->nAlloc);
    this->nAlloc = n;
    this->ptr = pBVar4;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }